

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O3

TPZCompEl * __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_>::Clone
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_> *this,TPZCompMesh *mesh)

{
  TPZCompElH1<pzshape::TPZShapeQuad> *this_00;
  
  this_00 = (TPZCompElH1<pzshape::TPZShapeQuad> *)operator_new(200);
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_01976950;
  TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1
            (this_00,&PTR_PTR_01971380,mesh,&this->super_TPZCompElH1<pzshape::TPZShapeQuad>);
  *(undefined8 *)
   &this_00[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = 0;
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElPostProc_01970fb0;
  return (TPZCompEl *)this_00;
}

Assistant:

inline TPZCompEl * TPZCompElPostProc<TCOMPEL>::Clone(TPZCompMesh &mesh) const{
    return new TPZCompElPostProc<TCOMPEL> (mesh, *this);
}